

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.h
# Opt level: O0

void __thiscall mnf::PointMemory::~PointMemory(PointMemory *this)

{
  PointMemory *this_local;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this);
  return;
}

Assistant:

class MANIFOLDS_API PointMemory
{
 protected:
  PointMemory(Index size);
  PointMemory(const ConstRefVec& v);
  Eigen::VectorXd& getMem();

 private:
  Eigen::VectorXd mem_;
}